

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmBlock *block)

{
  VmInstruction *pVVar1;
  bool bVar2;
  VmInstruction *next;
  VmInstruction *curr;
  VmBlock *block_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  bVar2 = SmallArray<VmValue_*,_8U>::empty(&(block->super_VmValue).users);
  if ((!bVar2) || (bVar2 = VmBlock::HasExternalInstructionUsers(block), bVar2)) {
    next = block->firstInstruction;
    while (next != (VmInstruction *)0x0) {
      pVVar1 = next->nextSibling;
      RunDeadCodeElimiation(ctx,module,next);
      next = pVVar1;
    }
  }
  else {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    VmFunction::RemoveBlock(block->parent,block);
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmBlock *block)
{
	if(block->users.empty() && !block->HasExternalInstructionUsers())
	{
		module->deadCodeEliminations++;

		block->parent->RemoveBlock(block);
	}
	else
	{
		VmInstruction *curr = block->firstInstruction;

		while(curr)
		{
			VmInstruction *next = curr->nextSibling;
			RunDeadCodeElimiation(ctx, module, curr);
			curr = next;
		}
	}
}